

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

FILE * ly_out_file(ly_out *out,FILE *f)

{
  FILE *pFVar1;
  char *pcVar2;
  
  if (out == (ly_out *)0x0) {
    pcVar2 = "out";
  }
  else {
    if (out->type == LY_OUT_FILE) {
      pFVar1 = (out->method).f;
      if (f == (FILE *)0x0) {
        return pFVar1;
      }
      (out->method).f = f;
      return pFVar1;
    }
    pcVar2 = "out->type == LY_OUT_FILE";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_out_file");
  return (FILE *)0x0;
}

Assistant:

LIBYANG_API_DEF FILE *
ly_out_file(struct ly_out *out, FILE *f)
{
    FILE *prev_f;

    LY_CHECK_ARG_RET(NULL, out, out->type == LY_OUT_FILE, NULL);

    prev_f = out->method.f;

    if (f) {
        out->method.f = f;
    }

    return prev_f;
}